

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O1

void __thiscall CEExecOptions::AddObserverPars(CEExecOptions *this)

{
  double dVar1;
  CEObserver obs;
  allocator local_102;
  allocator local_101;
  string local_100;
  string local_e0;
  CEObserver local_c0;
  
  CEObserver::CEObserver(&local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"x,longitude",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,"Observer geographic longitude (degrees east positive)",&local_102
            );
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_e0,&local_100,0.0);
  std::__cxx11::string::~string((string *)&local_100);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_102);
  std::__cxx11::string::~string((string *)&local_e0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"y,latitude",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,"Observer geographic latitude (degrees)",&local_102);
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_e0,&local_100,0.0);
  std::__cxx11::string::~string((string *)&local_100);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_102);
  std::__cxx11::string::~string((string *)&local_e0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"elevation",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"Observer elevation (meters)",&local_102);
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_e0,&local_100,0.0);
  std::__cxx11::string::~string((string *)&local_100);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_102);
  std::__cxx11::string::~string((string *)&local_e0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"pressure",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,"Observer\'s atmospheric pressure (hPa)",&local_102);
  dVar1 = CEObserver::Pressure_hPa(&local_c0);
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_e0,&local_100,dVar1);
  std::__cxx11::string::~string((string *)&local_100);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_102);
  std::__cxx11::string::~string((string *)&local_e0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"humidity",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,"Observer\'s atmospheric humicity (0-1)",&local_102);
  dVar1 = CEObserver::RelativeHumidity(&local_c0);
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_e0,&local_100,dVar1);
  std::__cxx11::string::~string((string *)&local_100);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_102);
  std::__cxx11::string::~string((string *)&local_e0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"temperature",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,"Observer\'s atmospheric temperature (Celsius)",&local_102);
  dVar1 = CEObserver::Temperature_C(&local_c0);
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_e0,&local_100,dVar1);
  std::__cxx11::string::~string((string *)&local_100);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_102);
  std::__cxx11::string::~string((string *)&local_e0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"wavelength",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"Observing wavelength (micrometers)",&local_102)
  ;
  dVar1 = CEObserver::Wavelength_um(&local_c0);
  CLOptions::AddDoubleParam(&this->super_CLOptions,&local_e0,&local_100,dVar1);
  std::__cxx11::string::~string((string *)&local_100);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_102);
  std::__cxx11::string::~string((string *)&local_e0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_101);
  AddJDPar(this);
  CEObserver::~CEObserver(&local_c0);
  return;
}

Assistant:

inline
void CEExecOptions::AddObserverPars(void)
{
    CEObserver obs;
    AddDoubleParam("x,longitude", "Observer geographic longitude (degrees east positive)", 0.0);
    AddDoubleParam("y,latitude", "Observer geographic latitude (degrees)", 0.0);
    AddDoubleParam("elevation", "Observer elevation (meters)", 0.0);
    AddDoubleParam("pressure", "Observer's atmospheric pressure (hPa)", obs.Pressure_hPa());
    AddDoubleParam("humidity", "Observer's atmospheric humicity (0-1)", obs.RelativeHumidity());
    AddDoubleParam("temperature", "Observer's atmospheric temperature (Celsius)", obs.Temperature_C());
    AddDoubleParam("wavelength", "Observing wavelength (micrometers)", obs.Wavelength_um());

    // Add date parameter
    AddJDPar();
}